

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O2

void cfd::core::logger::log<std::__cxx11::string&,std::__cxx11::string&,bool&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               bool *args_2)

{
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar2;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  string sStack_88;
  pointer local_68;
  size_type sStack_60;
  pointer local_58;
  size_type sStack_50;
  ulong local_48;
  
  aVar2 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
           )args_2;
  bVar1 = IsEnableLogLevel(lvl);
  if (bVar1) {
    local_68 = (args->_M_dataplus)._M_p;
    sStack_60 = args->_M_string_length;
    local_58 = (args_1->_M_dataplus)._M_p;
    sStack_50 = args_1->_M_string_length;
    local_48 = (ulong)*args_2;
    bVar3 = ::fmt::v7::to_string_view<char,_0>(fmt);
    format_str.data_ = (char *)bVar3.size_;
    format_str.size_ = 0x7dd;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar2.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    ::fmt::v7::detail::vformat_abi_cxx11_(&sStack_88,(detail *)bVar3.data_,format_str,args_00);
    WriteLog(source,lvl,&sStack_88);
    ::std::__cxx11::string::~string((string *)&sStack_88);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}